

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

optional<slang::ConstantRange> __thiscall
slang::ast::RangeSelectExpression::evalRange
          (RangeSelectExpression *this,EvalContext *context,ConstantValue *val,bool enforceBounds)

{
  ConstantValue *pCVar1;
  bool bVar2;
  bitwidth_t bVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar7;
  _Storage<slang::ConstantRange,_true> _Var8;
  Diagnostic *pDVar9;
  ConstantRange CVar10;
  Type *pTVar11;
  Type *pTVar12;
  size_t sVar13;
  undefined7 in_register_00000009;
  long lVar14;
  _Storage<int,_true> _Var15;
  undefined4 uVar16;
  _Storage<int,_true> _Var17;
  uint uVar18;
  _Storage<int,_true> _Var19;
  _Storage<int,_true> _Var20;
  _Storage<slang::ConstantRange,_true> unaff_R15;
  _Storage<slang::ConstantRange,_true> _Var21;
  optional<slang::ConstantRange> oVar22;
  ConstantRange valueRange;
  ConstantValue cr;
  ConstantValue cl;
  _Storage<int,_true> local_98;
  _Storage<int,_true> _Stack_94;
  undefined4 local_8c;
  unsigned_long local_88;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  pCVar1 = context->queueTarget;
  if (*(__index_type *)
       ((long)&(val->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) == '\b') {
    context->queueTarget = val;
  }
  Expression::eval((ConstantValue *)&local_58,this->left_,context);
  Expression::eval((ConstantValue *)&local_80,this->right_,context);
  context->queueTarget = pCVar1;
  uVar16 = 0;
  if ((local_58._M_index == '\0') ||
     (local_8c = (undefined4)CONCAT71(in_register_00000009,enforceBounds), local_80._M_index == '\0'
     )) goto LAB_00432c84;
  pTVar12 = (this->value_->type).ptr;
  pvVar7 = std::
           get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                     ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_58);
  _Var8._M_value = (ConstantRange)SVInt::as<int>(pvVar7);
  pvVar7 = std::
           get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                     ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_80);
  unaff_R15._M_value = (ConstantRange)SVInt::as<int>(pvVar7);
  if (((ulong)_Var8 >> 0x20 & 1) == 0) {
    pDVar9 = EvalContext::addDiag(context,(DiagCode)0x5c0007,this->left_->sourceRange);
    unaff_R15 = (_Storage<slang::ConstantRange,_true>)&local_58;
LAB_00432c6a:
    pDVar9 = Diagnostic::operator<<(pDVar9,(ConstantValue *)unaff_R15);
    ast::operator<<(pDVar9,pTVar12);
  }
  else {
    if (((ulong)unaff_R15 & 0x100000000) == 0) {
      pDVar9 = EvalContext::addDiag(context,(DiagCode)0x5c0007,this->right_->sourceRange);
      unaff_R15 = (_Storage<slang::ConstantRange,_true>)&local_80;
      goto LAB_00432c6a;
    }
    _Var20._M_value = unaff_R15._M_value.left;
    _Var17._M_value = _Var8._M_value.left;
    if (this->selectionKind == Simple) {
      lVar14 = (long)_Var20._M_value - (long)_Var17._M_value;
      if (_Var20._M_value < _Var17._M_value) {
        lVar14 = (long)_Var17._M_value - (long)_Var20._M_value;
      }
      if (0xffffffff7fffffff < lVar14 - 0x7fffffffU) goto LAB_00432d4e;
      EvalContext::addDiag(context,(DiagCode)0x8b0007,(this->super_Expression).sourceRange);
    }
    else {
      bVar2 = Type::hasFixedRange(pTVar12);
      if (bVar2) {
        CVar10 = Type::getFixedRange(pTVar12);
        bVar2 = CVar10.right <= CVar10.left;
      }
      else {
        bVar2 = false;
      }
      oVar22 = ConstantRange::getIndexedRange
                         (_Var17._M_value,_Var20._M_value,bVar2,this->selectionKind == IndexedUp);
      _Var8 = oVar22.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange>._M_payload;
      if (((undefined1  [12])
           oVar22.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) !=
          (undefined1  [12])0x0) {
        unaff_R15._M_value = _Var8._M_value >> 0x20;
LAB_00432d4e:
        bVar2 = Type::hasFixedRange(pTVar12);
        _Var17._M_value = _Var8._M_value.left;
        _Var20._M_value = unaff_R15._M_value.left;
        if (bVar2) {
          _local_98 = Type::getFixedRange(pTVar12);
          if ((this->warnedAboutRange == false) &&
             ((bVar2 = ConstantRange::containsPoint((ConstantRange *)&local_98,_Var17._M_value),
              !bVar2 || (bVar2 = ConstantRange::containsPoint
                                           ((ConstantRange *)&local_98,_Var20._M_value), !bVar2))))
          {
            pDVar9 = EvalContext::addDiag
                               (context,(DiagCode)0xd00007,(this->super_Expression).sourceRange);
            local_88 = (unsigned_long)_Var17._M_value;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<long>(&pDVar9->args,(long *)&local_88);
            local_88 = (unsigned_long)_Var20._M_value;
            std::
            vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
            ::emplace_back<long>(&pDVar9->args,(long *)&local_88);
            ast::operator<<(pDVar9,pTVar12);
          }
          if ((char)local_8c != '\0') {
            _Var19._M_value = _Stack_94._M_value;
            _Var15._M_value = local_98._M_value;
            if (_Stack_94._M_value < local_98._M_value) {
              _Var19._M_value = local_98._M_value;
              _Var15._M_value = _Stack_94._M_value;
            }
            if (_Var17._M_value <= _Var15._M_value) {
              _Var17 = _Var15;
            }
            if (_Var19._M_value < _Var17._M_value) {
              _Var17 = _Var19;
            }
            if (_Var15._M_value < _Var20._M_value) {
              _Var15._M_value = _Var20._M_value;
            }
            _Var20 = _Var15;
            if (_Var19._M_value < _Var15._M_value) {
              _Var20 = _Var19;
            }
          }
          pTVar11 = pTVar12->canonical;
          if (pTVar11 == (Type *)0x0) {
            Type::resolveCanonical(pTVar12);
            pTVar11 = pTVar12->canonical;
          }
          if ((pTVar11->super_Symbol).kind == PackedArrayType) {
            pTVar12 = Type::getArrayElementType(pTVar12);
            bVar3 = Type::getBitWidth(pTVar12);
            iVar4 = ConstantRange::translateIndex((ConstantRange *)&local_98,_Var17._M_value);
            iVar5 = ConstantRange::translateIndex((ConstantRange *)&local_98,_Var20._M_value);
            uVar18 = (iVar4 + 1) * bVar3 - 1;
            uVar6 = iVar5 * bVar3;
          }
          else {
            bVar2 = Type::isUnpackedArray(pTVar12);
            if (bVar2) {
              CVar10.right = local_98._M_value;
              CVar10.left = (int32_t)_Stack_94;
              _local_98 = CVar10;
            }
            uVar18 = ConstantRange::translateIndex((ConstantRange *)&local_98,_Var17._M_value);
            uVar6 = ConstantRange::translateIndex((ConstantRange *)&local_98,_Var20._M_value);
          }
          unaff_R15._M_value.right = 0;
          unaff_R15._M_value.left = uVar6;
          _Var8._M_value.right = 0;
          _Var8._M_value.left = uVar18;
          _Var21 = _Var8;
        }
        else {
          if (*(__index_type *)
               ((long)&(val->value).
                       super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               + 0x20) == '\0') {
            if ((_Var17._M_value < 0) || (_Var20._M_value < 0)) {
              pDVar9 = EvalContext::addDiag
                                 (context,(DiagCode)0xd00007,(this->super_Expression).sourceRange);
              local_88 = (unsigned_long)_Var17._M_value;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<long>(&pDVar9->args,(long *)&local_88);
              local_88 = (unsigned_long)_Var20._M_value;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<long>(&pDVar9->args,(long *)&local_88);
              ast::operator<<(pDVar9,pTVar12);
              if ((char)local_8c != '\0') {
                _Var8._M_value = _Var8._M_value & 0xffffffff;
                if (_Var17._M_value < 1) {
                  _Var8 = (_Storage<slang::ConstantRange,_true>)0x0;
                }
                _Var17._M_value = 0;
                if (0 < _Var20._M_value) {
                  _Var17._M_value = _Var20._M_value;
                }
                goto LAB_00432ff5;
              }
            }
          }
          else {
            sVar13 = ConstantValue::size(val);
            if ((((_Var17._M_value < 0) || (_Var20._M_value < 0)) ||
                (sVar13 <= ((ulong)_Var8 & 0xffffffff))) ||
               (sVar13 <= ((ulong)unaff_R15 & 0xffffffff))) {
              pDVar9 = EvalContext::addDiag
                                 (context,(DiagCode)0x24000c,(this->super_Expression).sourceRange);
              local_88 = (unsigned_long)_Var17._M_value;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<long>(&pDVar9->args,(long *)&local_88);
              local_88 = (unsigned_long)_Var20._M_value;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<long>(&pDVar9->args,(long *)&local_88);
              ast::operator<<(pDVar9,pTVar12);
              local_88 = sVar13;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&pDVar9->args,&local_88);
            }
            if ((char)local_8c != '\0') {
              if (_Var17._M_value < 0) {
                _Var17._M_value = 0;
              }
              _Var19._M_value = (int)sVar13;
              _Var8._M_value.right = 0;
              _Var8._M_value.left = _Var17._M_value;
              if (_Var19._M_value <= _Var17._M_value) {
                _Var8 = (_Storage<slang::ConstantRange,_true>)(sVar13 & 0xffffffff);
              }
              _Var17._M_value = 0;
              if (-1 < _Var20._M_value) {
                _Var17._M_value = _Var20._M_value;
              }
              if (_Var19._M_value <= _Var17._M_value) {
                _Var17._M_value = _Var19._M_value;
              }
LAB_00432ff5:
              unaff_R15._M_value.right = 0;
              unaff_R15._M_value.left = _Var17._M_value;
            }
          }
          _Var21._M_value = _Var8._M_value & 0xffffffff;
        }
        unaff_R15._M_value = _Var21._M_value | (long)unaff_R15 << 0x20;
        uVar16 = (undefined4)CONCAT71(_Var8._1_7_,1);
        goto LAB_00432c84;
      }
      EvalContext::addDiag(context,(DiagCode)0x8b0007,(this->super_Expression).sourceRange);
    }
  }
  uVar16 = 0;
LAB_00432c84:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_80);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  oVar22.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._8_4_ = uVar16;
  oVar22.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload = unaff_R15;
  return (optional<slang::ConstantRange>)
         oVar22.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>;
}

Assistant:

std::optional<ConstantRange> RangeSelectExpression::evalRange(EvalContext& context,
                                                              const ConstantValue& val,
                                                              bool enforceBounds) const {
    auto prevQ = context.getQueueTarget();
    if (val.isQueue())
        context.setQueueTarget(&val);

    ConstantValue cl = left().eval(context);
    ConstantValue cr = right().eval(context);

    context.setQueueTarget(prevQ);
    if (!cl || !cr)
        return std::nullopt;

    const Type& valueType = *value().type;
    std::optional<int32_t> li = cl.integer().as<int32_t>();
    std::optional<int32_t> ri = cr.integer().as<int32_t>();
    if (!li) {
        context.addDiag(diag::IndexValueInvalid, left().sourceRange) << cl << valueType;
        return std::nullopt;
    }
    if (!ri) {
        context.addDiag(diag::IndexValueInvalid, right().sourceRange) << cr << valueType;
        return std::nullopt;
    }

    ConstantRange result;
    if (selectionKind == RangeSelectionKind::Simple) {
        result = {*li, *ri};
        if (checkRangeOverflow(result, context, sourceRange))
            return std::nullopt;
    }
    else {
        bool isLittleEndian = false;
        if (valueType.hasFixedRange())
            isLittleEndian = valueType.getFixedRange().isLittleEndian();

        auto range = ConstantRange::getIndexedRange(*li, *ri, isLittleEndian,
                                                    selectionKind == RangeSelectionKind::IndexedUp);
        if (!range) {
            context.addDiag(diag::RangeWidthOverflow, sourceRange);
            return std::nullopt;
        }

        result = *range;
    }

    if (valueType.hasFixedRange()) {
        ConstantRange valueRange = valueType.getFixedRange();
        if (!warnedAboutRange &&
            (!valueRange.containsPoint(result.left) || !valueRange.containsPoint(result.right))) {
            auto& diag = context.addDiag(diag::RangeOOB, sourceRange);
            diag << result.left << result.right;
            diag << valueType;
        }

        if (enforceBounds) {
            result.left = std::min(std::max(result.left, valueRange.lower()), valueRange.upper());
            result.right = std::min(std::max(result.right, valueRange.lower()), valueRange.upper());
        }

        if (!valueType.isPackedArray()) {
            if (valueType.isUnpackedArray()) {
                // Unpacked arrays are stored reversed in memory, so reverse the range here.
                valueRange = valueRange.reverse();
            }
            result.left = valueRange.translateIndex(result.left);
            result.right = valueRange.translateIndex(result.right);
            return result;
        }

        // For packed arrays we're potentially selecting multi-bit elements.
        int32_t width = (int32_t)valueType.getArrayElementType()->getBitWidth();
        result.left = valueRange.translateIndex(result.left) * width + width - 1;
        result.right = valueRange.translateIndex(result.right) * width;

        return result;
    }

    // Out of bounds ranges are allowed, we just issue a warning.
    if (!val.bad()) {
        size_t size = val.size();
        if (result.left < 0 || result.right < 0 || size_t(result.left) >= size ||
            size_t(result.right) >= size) {

            auto& diag = context.addDiag(diag::ConstEvalDynamicArrayRange, sourceRange);
            diag << result.left << result.right;
            diag << valueType;
            diag << size;
        }

        if (enforceBounds) {
            result.left = std::min(std::max(result.left, 0), int32_t(size));
            result.right = std::min(std::max(result.right, 0), int32_t(size));
        }
    }
    else if (result.left < 0 || result.right < 0) {
        auto& diag = context.addDiag(diag::RangeOOB, sourceRange);
        diag << result.left << result.right;
        diag << valueType;

        if (enforceBounds) {
            result.left = std::max(result.left, 0);
            result.right = std::max(result.right, 0);
        }
    }

    return result;
}